

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::AssertionItemPortListSyntax::setChild
          (AssertionItemPortListSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  
  if (index == 2) {
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar5 = pvVar9->field_0x2;
    NVar6.raw = (pvVar9->numFlags).raw;
    uVar7 = pvVar9->rawLen;
    pIVar3 = pvVar9->info;
    (this->closeParen).kind = pvVar9->kind;
    (this->closeParen).field_0x2 = uVar5;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->closeParen).rawLen = uVar7;
    (this->closeParen).info = pIVar3;
  }
  else if (index == 1) {
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar1 = *ppSVar8;
    uVar4 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->ports).super_SyntaxListBase.super_SyntaxNode.kind = pSVar1->kind;
    *(undefined4 *)&(this->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
    (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->ports).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar1->previewNode;
    (this->ports).super_SyntaxListBase.childCount = *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->ports).elements._M_ptr = (pointer)pSVar1[1].parent;
    (this->ports).elements._M_extent._M_extent_value = (size_t)pSVar2;
  }
  else {
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar5 = pvVar9->field_0x2;
    NVar6.raw = (pvVar9->numFlags).raw;
    uVar7 = pvVar9->rawLen;
    pIVar3 = pvVar9->info;
    (this->openParen).kind = pvVar9->kind;
    (this->openParen).field_0x2 = uVar5;
    (this->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->openParen).rawLen = uVar7;
    (this->openParen).info = pIVar3;
  }
  return;
}

Assistant:

void AssertionItemPortListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: ports = child.node()->as<SeparatedSyntaxList<AssertionItemPortSyntax>>(); return;
        case 2: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}